

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_whitespace
          (CATNMachine<wchar_t> *this,CharClass<wchar_t> *cc,int origin,int tag)

{
  int iVar1;
  bool local_55;
  int local_54;
  CharClass<wchar_t> local_50;
  
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001a14f0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = add_node(this,&local_50,origin,tag);
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001a14f0;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            (&local_50.m_ranges);
  local_50._vptr_CharClass = (_func_int **)CONCAT44(local_50._vptr_CharClass._4_4_,iVar1);
  local_54 = 0;
  local_55 = false;
  std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>::
  emplace_back<Centaurus::CharClass<wchar_t>const&,int&,bool,int&>
            ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
              *)&(this->m_nodes).
                 super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar1].m_transitions,cc,(int *)&local_50,
             &local_55,&local_54);
  return iVar1;
}

Assistant:

int import_whitespace(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        origin = add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes[origin].add_transition(cc, origin);
        return origin;
    }